

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR1.cpp
# Opt level: O2

void __thiscall LR::build(LR *this)

{
  mapped_type mVar1;
  bool bVar2;
  __type _Var3;
  undefined4 uVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>_>_>
  *this_00;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  pointer pIVar9;
  _Self __tmp;
  ulong uVar10;
  ulong uVar11;
  pointer pIVar12;
  string *psVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  string X;
  Item goto_item;
  Item item;
  vector<Prod,_std::allocator<Prod>_> g_prods;
  Prod prod;
  string local_50;
  
  poVar5 = std::operator<<((ostream *)&std::cout,"build...");
  std::endl<char,std::char_traits<char>>(poVar5);
  items(this);
  uVar14 = 0;
  do {
    pIVar12 = (this->C).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
              super__Vector_impl_data._M_start;
    pIVar9 = (this->C).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((ulong)(((long)pIVar9 - (long)pIVar12) / 0x18) <= uVar14) {
      this_00 = &this->ACTION;
      uVar14 = 0;
      do {
        if ((ulong)(((long)pIVar9 - (long)pIVar12) / 0x18) <= uVar14) {
          poVar5 = std::operator<<((ostream *)&std::cout,"build...end");
          std::endl<char,std::char_traits<char>>(poVar5);
          return;
        }
        std::vector<Prod,_std::allocator<Prod>_>::vector(&goto_item.prods,&pIVar12[uVar14].prods);
        for (uVar10 = 0;
            uVar10 < (ulong)(((long)goto_item.prods.super__Vector_base<Prod,_std::allocator<Prod>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)goto_item.prods.super__Vector_base<Prod,_std::allocator<Prod>_>.
                                   _M_impl.super__Vector_impl_data._M_start) / 0x98);
            uVar10 = uVar10 + 1) {
          Prod::Prod(&prod,goto_item.prods.super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.
                           super__Vector_impl_data._M_start + uVar10);
          for (uVar11 = 0;
              uVar11 < (ulong)((long)prod.right.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)prod.right.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar11 = uVar11 + 1) {
            bVar2 = std::operator==(prod.right.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar11,".");
            uVar4 = (undefined4)uVar14;
            if ((bVar2) &&
               (uVar11 < ((long)prod.right.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)prod.right.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
              std::__cxx11::string::string
                        ((string *)&item,
                         (string *)
                         (prod.right.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar11 + 1));
              bVar2 = isVt((string *)&item);
              psVar13 = (string *)&item;
              if (bVar2) {
                X._M_dataplus._M_p._0_4_ = uVar4;
                std::__cxx11::string::string((string *)&X._M_string_length,(string *)&item);
                pmVar6 = std::
                         map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                         ::operator[](&this->GOTO,(key_type *)&X);
                mVar1 = *pmVar6;
                std::__cxx11::string::~string((string *)&X._M_string_length);
                X._M_dataplus._M_p._0_4_ = uVar4;
                std::__cxx11::string::string((string *)&X._M_string_length,(string *)&item);
                pmVar7 = std::
                         map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>_>_>
                         ::operator[](this_00,(key_type *)&X);
                pmVar7->first = SHIFT;
                pmVar7->second = mVar1;
                std::__cxx11::string::~string((string *)&X._M_string_length);
              }
LAB_001058e7:
              std::__cxx11::string::~string((string *)psVar13);
            }
            else {
              bVar2 = std::operator==(prod.right.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + uVar11,".");
              if ((bVar2) &&
                 ((((long)prod.right.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)prod.right.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U == uVar11 &&
                  (bVar2 = std::operator!=(&prod.noTerminal,"S\'"), bVar2)))) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase(&prod.right,
                        (const_iterator)
                        prod.right.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
                std::vector<Prod,_std::allocator<Prod>_>::vector
                          (&g_prods,(vector<Prod,_std::allocator<Prod>_> *)this);
                for (p_Var8 = prod.additionalVt._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                    ; (_Rb_tree_header *)p_Var8 !=
                      &prod.additionalVt._M_t._M_impl.super__Rb_tree_header;
                    p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
                  std::__cxx11::string::string((string *)&item,(string *)(p_Var8 + 1));
                  lVar17 = 0;
                  for (uVar16 = 0;
                      uVar16 < (ulong)(((long)g_prods.
                                              super__Vector_base<Prod,_std::allocator<Prod>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                       (long)g_prods.super__Vector_base<Prod,_std::allocator<Prod>_>
                                             ._M_impl.super__Vector_impl_data._M_start) / 0x98);
                      uVar16 = uVar16 + 1) {
                    _Var3 = std::operator==(&prod.noTerminal,
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)((long)&((g_prods.
                                                  super__Vector_base<Prod,_std::allocator<Prod>_>.
                                                  _M_impl.super__Vector_impl_data._M_start)->
                                                  noTerminal)._M_dataplus._M_p + lVar17));
                    if ((_Var3) &&
                       (bVar2 = std::operator==(&prod.right,
                                                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)((long)&((g_prods.
                                                  super__Vector_base<Prod,_std::allocator<Prod>_>.
                                                  _M_impl.super__Vector_impl_data._M_start)->right).
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar17
                                                  )), bVar2)) {
                      X._M_dataplus._M_p._0_4_ = uVar4;
                      std::__cxx11::string::string((string *)&X._M_string_length,(string *)&item);
                      pmVar7 = std::
                               map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>_>_>
                               ::operator[](this_00,(key_type *)&X);
                      pmVar7->first = REDUCE;
                      pmVar7->second = (int)uVar16;
                      std::__cxx11::string::~string((string *)&X._M_string_length);
                    }
                    lVar17 = lVar17 + 0x98;
                  }
                  std::__cxx11::string::~string((string *)&item);
                }
                std::vector<Prod,_std::allocator<Prod>_>::~vector(&g_prods);
              }
              else {
                bVar2 = std::operator==(prod.right.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar11,".");
                if (((bVar2) &&
                    (((long)prod.right.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)prod.right.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U == uVar11)) &&
                   (bVar2 = std::operator==(&prod.noTerminal,"S\'"), bVar2)) {
                  item.prods.super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_18416;
                  item.prods.super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.
                  super__Vector_impl_data._M_start._0_4_ = uVar4;
                  std::
                  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::pair<int,_const_char_*,_true>
                            ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&X,(pair<int,_const_char_*> *)&item);
                  pmVar7 = std::
                           map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>_>_>
                           ::operator[](this_00,(pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                 *)&X);
                  pmVar7->first = ACCEPT;
                  pmVar7->second = -1;
                  psVar13 = (string *)&X._M_string_length;
                  goto LAB_001058e7;
                }
              }
            }
          }
          Prod::~Prod(&prod);
        }
        std::vector<Prod,_std::allocator<Prod>_>::~vector(&goto_item.prods);
        uVar14 = uVar14 + 1;
        pIVar12 = (this->C).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pIVar9 = (this->C).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      } while( true );
    }
    std::vector<Prod,_std::allocator<Prod>_>::vector(&item.prods,&pIVar12[uVar14].prods);
    for (lVar17 = 0; lVar17 != 0x2c; lVar17 = lVar17 + 1) {
      psVar13 = str_all_abi_cxx11_ + lVar17;
      std::__cxx11::string::string((string *)&local_50,(string *)psVar13);
      Goto(&goto_item,this,&item,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string((string *)&X,(string *)psVar13);
      lVar15 = 0;
      for (uVar10 = 0;
          pIVar12 = (this->C).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                    super__Vector_impl_data._M_start,
          uVar10 < (ulong)(((long)(this->C).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)pIVar12) / 0x18);
          uVar10 = uVar10 + 1) {
        bVar2 = Item::operator==(&goto_item,
                                 (Item *)((long)&(pIVar12->prods).
                                                 super__Vector_base<Prod,_std::allocator<Prod>_>.
                                                 _M_impl + lVar15));
        if (bVar2) {
          prod.noTerminal._M_dataplus._M_p._0_4_ = (undefined4)uVar14;
          std::__cxx11::string::string
                    ((string *)&prod.noTerminal._M_string_length,(string *)psVar13);
          pmVar6 = std::
                   map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                   ::operator[](&this->GOTO,(key_type *)&prod);
          *pmVar6 = (mapped_type)uVar10;
          std::__cxx11::string::~string((string *)&prod.noTerminal._M_string_length);
          break;
        }
        lVar15 = lVar15 + 0x18;
      }
      std::__cxx11::string::~string((string *)&X);
      std::vector<Prod,_std::allocator<Prod>_>::~vector(&goto_item.prods);
    }
    std::vector<Prod,_std::allocator<Prod>_>::~vector(&item.prods);
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

void LR::build() { // 构造Action、GOTO表
    cout << "build..." << endl;
    items();
//    cout << "items end" << endl;

    for (int i = 0; i < C.size(); ++i) { // 逐个项目集
        Item item = C[i];
        //GOTO
        int length = sizeof(str_all) / sizeof(str_all[0]);
        for (int j = 0; j < length; j++) {
            Item goto_item = Goto(item, str_all[j]);
            string X = str_all[j];
            for (int m = 0; m < C.size(); m++) {
                if (goto_item == C[m]) {
                    GOTO[make_pair(i, str_all[j])] = m;
                    break;
                }
            }
        }
    }
    for (int i = 0; i < C.size(); ++i) { // 逐个项目集
        Item item = C[i];
        //Action
        for (int k = 0; k < item.prods.size(); k++) { // 逐个项目
            Prod prod = item.prods[k];
            for (int j = 0; j < prod.right.size(); j++) {
                if (prod.right[j] == "." && j < prod.right.size() - 1) {//A->α.aβ,b
                    string a = prod.right[j + 1];
                    if (isVt(a)) { // 终结符
                        int goto_index = GOTO[make_pair(i, a)];
                        ACTION[make_pair(i, a)] = make_pair(SHIFT, goto_index);
                    }
                } else if (prod.right[j] == "." && j == prod.right.size() - 1
                           && prod.noTerminal != "S'") {//A->α.,a
                    prod.right.erase(prod.right.end());//去掉最后的 . ,否则在后边的G文法项目比较的时候找不到相等的
                    vector<Prod> g_prods = G.prods;
                    for (set<string>::iterator it = prod.additionalVt.begin();
                         it != prod.additionalVt.end(); it++) {
                        string a = *it;
                        int m = 0;
                        for (m = 0; m < g_prods.size(); m++) {
                            if (prod.noTerminal == g_prods[m].noTerminal
                                && prod.right == g_prods[m].right) {
                                ACTION[make_pair(i, a)] = make_pair(REDUCE, m);
                            }
                        }
                    }
                } else if (prod.right[j] == "." && j == prod.right.size() - 1
                           && prod.noTerminal == "S'") {//A->α.,a
                    ACTION[make_pair(i, "#")] = make_pair(ACCEPT, -1);
                }
            }
        }

    }
    cout << "build...end" << endl;
}